

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

TPZManVector<long,_3> * __thiscall
TPZManVector<long,_3>::operator=(TPZManVector<long,_3> *this,TPZManVector<long,_3> *rval)

{
  ulong uVar1;
  long *plVar2;
  int iVar3;
  ulong uVar4;
  long *plVar5;
  
  if (this == rval) goto LAB_01016634;
  uVar1 = (rval->super_TPZVec<long>).fNElements;
  plVar2 = (this->super_TPZVec<long>).fStore;
  plVar5 = this->fExtAlloc;
  if (plVar2 != plVar5 && plVar2 != (long *)0x0) {
    operator_delete__(plVar2);
    (this->super_TPZVec<long>).fStore = (long *)0x0;
    (this->super_TPZVec<long>).fNAlloc = 0;
  }
  if ((long)uVar1 < 4) {
    uVar4 = 0;
    iVar3 = 0;
    if (0 < (long)uVar1) {
      do {
        plVar5[uVar4] = rval->fExtAlloc[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
      iVar3 = (int)uVar1;
      if (2 < uVar1) {
        uVar4 = 0;
        goto LAB_01016628;
      }
    }
    memset((void *)((long)this->fExtAlloc + (ulong)(uint)(iVar3 * 8)),0,
           (ulong)(iVar3 * -8 + 0x10) + 8);
    uVar4 = 0;
  }
  else {
    plVar5 = (rval->super_TPZVec<long>).fStore;
    uVar4 = uVar1;
  }
LAB_01016628:
  (this->super_TPZVec<long>).fStore = plVar5;
  (this->super_TPZVec<long>).fNAlloc = uVar4;
  (this->super_TPZVec<long>).fNElements = uVar1;
LAB_01016634:
  (rval->super_TPZVec<long>).fStore = (long *)0x0;
  (rval->super_TPZVec<long>).fNElements = 0;
  (rval->super_TPZVec<long>).fNAlloc = 0;
  return this;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(TPZManVector< T, NumExtAlloc >&& rval) {
    // Checking auto assignment.
    if (this != &rval) {
      const int64_t nel = rval.NElements();
      //let us dispose of previously allocated memory
      if (this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = nullptr;
        this->fNAlloc = 0;
      }
      if (nel <= NumExtAlloc) {
        //we need to copy, unfortunately
        int i = 0;
        for(; i < nel; i++) {fExtAlloc[i] = rval.fExtAlloc[i];}
        for(; i < NumExtAlloc; i++){fExtAlloc[i] = T();}
        this->fStore = fExtAlloc;
        this->fNAlloc = 0;
        this->fNElements = nel;
      } else {
        this->fStore = rval.fStore;
        this->fNAlloc = nel;
        this->fNElements = nel;
      }
    }
    rval.fStore = nullptr;
    rval.fNAlloc = 0;
    rval.fNElements = 0;
    return *this;
}